

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall VolumeFile::unpackNode(VolumeFile *this,NodeKey *nodeKey,string *filePath)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  uint64_t uVar5;
  VolumeFile *this_00;
  ostream *poVar6;
  string *in_RDX;
  NodeKey *in_RSI;
  VolumeFile *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> unexpandedData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint32_t uncompressedSize;
  uint64_t offset;
  value_type *streamDesc;
  uint32_t volumeIndex;
  void *in_stack_00000120;
  string *in_stack_00000128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  uint32_t seed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  uint64_t in_stack_fffffffffffffee8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef0;
  VolumeFile *in_stack_fffffffffffffef8;
  uint64_t in_stack_ffffffffffffff00;
  uint64_t in_stack_ffffffffffffff08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  ifstream *in_stack_ffffffffffffff18;
  VolumeFile *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  undefined4 local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uint32_t local_3c;
  long local_38;
  reference local_30;
  uint local_24;
  string *local_20;
  NodeKey *local_18;
  byte local_1;
  
  seed = (uint32_t)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_24 = NodeKey::volumeIndex(in_RSI);
  uVar3 = (ulong)local_24;
  sVar4 = std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::size
                    (&in_RDI->m_dataStreams);
  if (uVar3 < sVar4) {
    local_30 = std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::
               operator[](&in_RDI->m_dataStreams,(ulong)local_24);
    uVar5 = dataOffset(in_RDI);
    uVar2 = NodeKey::sectorIndex(local_18);
    local_38 = uVar5 + (ulong)uVar2 * (ulong)local_30->sectorSize;
    local_3c = NodeKey::size2(local_18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1332de);
    NodeKey::size1(local_18);
    bVar1 = readDataAt(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                       ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (bVar1) {
      pvVar7 = &local_58;
      this_00 = (VolumeFile *)
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133398);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar7);
      NodeKey::nodeIndex(local_18);
      decryptData(in_stack_fffffffffffffef8,(uint8_t *)in_stack_fffffffffffffef0,
                  in_stack_fffffffffffffee8,seed);
      inflateDataIfNeeded(this_00,pvVar7,
                          CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
      bVar1 = FileExpand::checkIfExpanded(in_stack_fffffffffffffed8);
      if (bVar1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13342e);
        bVar1 = FileExpand::unexpand
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,pvVar7);
        if (bVar1) {
          pvVar7 = &local_80;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13346f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar7);
          saveToFile(in_stack_00000128,in_stack_00000120,(size_t)this);
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Error whilst unexpanding file: ");
          poVar6 = std::operator<<(poVar6,local_20);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  (in_stack_fffffffffffffef0);
      }
      else {
        pvVar7 = &local_58;
        in_stack_fffffffffffffef0 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133530);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar7);
        saveToFile(in_stack_00000128,in_stack_00000120,(size_t)this);
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    local_68 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffef0);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool VolumeFile::unpackNode(const NodeKey& nodeKey, const std::string& filePath)
{
	const auto volumeIndex = nodeKey.volumeIndex();
	if (volumeIndex >= m_dataStreams.size()) {
		return false;
	}
	auto& streamDesc = m_dataStreams[volumeIndex];
	
	const auto offset = dataOffset() + static_cast<uint64_t>(nodeKey.sectorIndex()) * streamDesc.sectorSize;
	const auto uncompressedSize = nodeKey.size2();
	
	std::vector<uint8_t> data;
	if (!readDataAt(streamDesc.stream, data, offset, nodeKey.size1())) {
		return false;
	}

	decryptData(data.data(), data.size(), nodeKey.nodeIndex());
	inflateDataIfNeeded(data, uncompressedSize);
	
	if (FileExpand::checkIfExpanded(data)) {
		std::vector<uint8_t> unexpandedData;
		if (FileExpand::unexpand(data, unexpandedData)) {
			saveToFile(filePath, unexpandedData.data(), unexpandedData.size());
		} else {
			std::cerr << "Error whilst unexpanding file: " << filePath << std::endl;
		}
	} else {
		saveToFile(filePath, data.data(), data.size());
	}
	
	return true;
}